

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeBase *
ResolveGenericTypeAliases
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,IntrusiveList<MatchData> aliases)

{
  longlong length;
  undefined8 *puVar1;
  IntrusiveList<TypeHandle> arguments_00;
  IntrusiveList<TypeHandle> generics;
  bool bVar2;
  int iVar3;
  TypeUnsizedArray *pTVar4;
  TypeHandle *pTVar5;
  TypeBase *pTVar6;
  TypeRef *pTVar7;
  TypeArray *pTVar8;
  TypeBase *pTVar9;
  undefined4 extraout_var_00;
  MatchData *pMVar10;
  char *msg;
  byte bVar11;
  uint *puVar12;
  IntrusiveList<TypeHandle> arguments;
  undefined4 extraout_var;
  
  pMVar10 = aliases.head;
  if ((pMVar10 != (MatchData *)0x0 & type->isGeneric) == 1) {
    switch(type->typeID) {
    case 0xc:
      break;
    case 0xd:
      for (; pMVar10 != (MatchData *)0x0; pMVar10 = pMVar10->next) {
        bVar2 = InplaceStr::operator==
                          (&pMVar10->name->name,(InplaceStr *)(type[1]._vptr_TypeBase + 8));
        if (bVar2) {
          return pMVar10->type;
        }
      }
      type = ctx->typeGeneric;
      break;
    default:
      msg = "ERROR: unknown generic type resolve";
LAB_00166e04:
      anon_unknown.dwarf_b837c::Stop(ctx,source,msg);
    case 0x12:
      pTVar9 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)type[1]._vptr_TypeBase,aliases);
      pTVar7 = ExpressionContext::GetReferenceType(ctx,pTVar9);
      return &pTVar7->super_TypeBase;
    case 0x13:
      pTVar9 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)type[1]._vptr_TypeBase,aliases);
      length._0_4_ = type[1].typeID;
      length._4_4_ = type[1].nameHash;
      pTVar8 = ExpressionContext::GetArrayType(ctx,pTVar9,length);
      return &pTVar8->super_TypeBase;
    case 0x14:
      pTVar9 = ResolveGenericTypeAliases(ctx,source,*(TypeBase **)&type[1].typeIndex,aliases);
      pTVar4 = ExpressionContext::GetUnsizedArrayType(ctx,pTVar9);
      return (TypeBase *)pTVar4;
    case 0x15:
      pTVar9 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)type[1]._vptr_TypeBase,aliases);
      arguments.head = (TypeHandle *)0x0;
      arguments.tail = (TypeHandle *)0x0;
      puVar12 = &type[1].typeID;
      while (puVar1 = *(undefined8 **)puVar12, puVar1 != (undefined8 *)0x0) {
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        pTVar5 = (TypeHandle *)CONCAT44(extraout_var,iVar3);
        pTVar6 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)*puVar1,aliases);
        pTVar5->type = pTVar6;
        pTVar5->next = (TypeHandle *)0x0;
        pTVar5->listed = false;
        IntrusiveList<TypeHandle>::push_back(&arguments,pTVar5);
        puVar12 = (uint *)(puVar1 + 1);
      }
      arguments_00.tail = arguments.tail;
      arguments_00.head = arguments.head;
      type = &ExpressionContext::GetFunctionType(ctx,source,pTVar9,arguments_00)->super_TypeBase;
      break;
    case 0x17:
      arguments.head = (TypeHandle *)0x0;
      arguments.tail = (TypeHandle *)0x0;
      bVar11 = 0;
      puVar12 = &type[1].typeID;
      while (puVar1 = *(undefined8 **)puVar12, puVar1 != (undefined8 *)0x0) {
        pTVar9 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)*puVar1,aliases);
        if (pTVar9 == ctx->typeAuto) {
          msg = "ERROR: \'auto\' type cannot be used as template argument";
          goto LAB_00166e04;
        }
        bVar11 = bVar11 & 1 | pTVar9->isGeneric;
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        pTVar5 = (TypeHandle *)CONCAT44(extraout_var_00,iVar3);
        pTVar5->type = pTVar9;
        pTVar5->next = (TypeHandle *)0x0;
        pTVar5->listed = false;
        IntrusiveList<TypeHandle>::push_back(&arguments,pTVar5);
        puVar12 = (uint *)(puVar1 + 1);
      }
      if ((bVar11 & 1) == 0) {
        type = CreateGenericTypeInstance
                         (ctx,source,(TypeGenericClassProto *)type[1]._vptr_TypeBase,&arguments);
      }
      else {
        generics.tail = arguments.tail;
        generics.head = arguments.head;
        type = &ExpressionContext::GetGenericClassType
                          (ctx,source,(TypeGenericClassProto *)type[1]._vptr_TypeBase,generics)->
                super_TypeBase;
      }
    }
  }
  return &((TypeGenericClass *)type)->super_TypeBase;
}

Assistant:

TypeBase* ResolveGenericTypeAliases(ExpressionContext &ctx, SynBase *source, TypeBase *type, IntrusiveList<MatchData> aliases)
{
	if(!type->isGeneric || aliases.empty())
		return type;

	// Replace with alias type if there is a match, otherwise leave as generic
	if(isType<TypeGeneric>(type))
		return type;

	// Replace with alias type if there is a match, otherwise leave as generic
	if(TypeGenericAlias *lhs = getType<TypeGenericAlias>(type))
	{
		for(MatchData *curr = aliases.head; curr; curr = curr->next)
		{
			if(curr->name->name == lhs->baseName->name)
				return curr->type;
		}

		return ctx.typeGeneric;
	}

	if(TypeRef *lhs = getType<TypeRef>(type))
		return ctx.GetReferenceType(ResolveGenericTypeAliases(ctx, source, lhs->subType, aliases));

	if(TypeArray *lhs = getType<TypeArray>(type))
		return ctx.GetArrayType(ResolveGenericTypeAliases(ctx, source, lhs->subType, aliases), lhs->length);

	if(TypeUnsizedArray *lhs = getType<TypeUnsizedArray>(type))
		return ctx.GetUnsizedArrayType(ResolveGenericTypeAliases(ctx, source, lhs->subType, aliases));

	if(TypeFunction *lhs = getType<TypeFunction>(type))
	{
		TypeBase *returnType = ResolveGenericTypeAliases(ctx, source, lhs->returnType, aliases);

		IntrusiveList<TypeHandle> arguments;

		for(TypeHandle *curr = lhs->arguments.head; curr; curr = curr->next)
			arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(ResolveGenericTypeAliases(ctx, source, curr->type, aliases)));

		return ctx.GetFunctionType(source, returnType, arguments);
	}

	if(TypeGenericClass *lhs = getType<TypeGenericClass>(type))
	{
		bool isGeneric = false;
		IntrusiveList<TypeHandle> types;

		for(TypeHandle *curr = lhs->generics.head; curr; curr = curr->next)
		{
			TypeBase *resolvedType = ResolveGenericTypeAliases(ctx, source, curr->type, aliases);

			if(resolvedType == ctx.typeAuto)
				Stop(ctx, source, "ERROR: 'auto' type cannot be used as template argument");

			isGeneric |= resolvedType->isGeneric;

			types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(resolvedType));
		}

		if(isGeneric)
			return ctx.GetGenericClassType(source, lhs->proto, types);

		return CreateGenericTypeInstance(ctx, source, lhs->proto, types);
	}

	Stop(ctx, source, "ERROR: unknown generic type resolve");

	return NULL;
}